

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

void hash_table_rehash(HashTable *ht,int new_size_index)

{
  uint32_t uVar1;
  HashEntry *pHVar2;
  HashEntry *entry;
  HashTable old_ht;
  
  if (0x1e < new_size_index) {
    return;
  }
  pHVar2 = (HashEntry *)raviX_calloc((ulong)hash_sizes[new_size_index].size,0x18);
  old_ht.table = ht->table;
  old_ht.hash_function = ht->hash_function;
  old_ht.key_equals_function = ht->key_equals_function;
  old_ht.size = ht->size;
  old_ht.rehash = ht->rehash;
  old_ht.max_entries = ht->max_entries;
  old_ht.size_index = ht->size_index;
  old_ht.entries = ht->entries;
  old_ht.deleted_entries = ht->deleted_entries;
  entry = (HashEntry *)0x0;
  ht->table = pHVar2;
  ht->size_index = new_size_index;
  uVar1 = hash_sizes[(uint)new_size_index].rehash;
  ht->size = hash_sizes[(uint)new_size_index].size;
  ht->rehash = uVar1;
  ht->max_entries = hash_sizes[(uint)new_size_index].max_entries;
  ht->entries = 0;
  ht->deleted_entries = 0;
  while( true ) {
    entry = raviX_hash_table_next_entry(&old_ht,entry);
    if (entry == (HashEntry *)0x0) break;
    raviX_hash_table_insert_pre_hashed(ht,entry->hash,entry->key,entry->data);
  }
  raviX_free(old_ht.table);
  return;
}

Assistant:

static void
hash_table_rehash(HashTable *ht, int new_size_index)
{
	HashTable old_ht;
	HashEntry *table, *entry;

	if (new_size_index >= ARRAY_SIZE(hash_sizes))
		return;

	table = (HashEntry *) raviX_calloc(hash_sizes[new_size_index].size, sizeof(*ht->table));

	old_ht = *ht;

	ht->table = table;
	ht->size_index = new_size_index;
	ht->size = hash_sizes[ht->size_index].size;
	ht->rehash = hash_sizes[ht->size_index].rehash;
	ht->max_entries = hash_sizes[ht->size_index].max_entries;
	ht->entries = 0;
	ht->deleted_entries = 0;

	hash_table_foreach(&old_ht, entry) {
		raviX_hash_table_insert_pre_hashed(ht, entry->hash,
					     entry->key, entry->data);
	}

	raviX_free(old_ht.table);
}